

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O1

void duckdb_je_tsd_slow_update(tsd_t *tsd)

{
  uint8_t uVar1;
  byte bVar2;
  
  do {
    bVar2 = (tsd->state).repr;
    if ((((bVar2 < 3) && (bVar2 = 1, duckdb_je_malloc_slow == false)) &&
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) &&
       (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01')) {
      bVar2 = tsd_global_slow_count.repr != 0;
    }
    LOCK();
    uVar1 = (tsd->state).repr;
    (tsd->state).repr = bVar2;
    UNLOCK();
  } while (uVar1 == '\x02');
  duckdb_je_te_recompute_fast_threshold(tsd);
  return;
}

Assistant:

void
tsd_slow_update(tsd_t *tsd) {
	uint8_t old_state;
	do {
		uint8_t new_state = tsd_state_compute(tsd);
		old_state = tsd_atomic_exchange(&tsd->state, new_state,
		    ATOMIC_ACQUIRE);
	} while (old_state == tsd_state_nominal_recompute);

	te_recompute_fast_threshold(tsd);
}